

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O0

vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> * __thiscall
cmGeneratorExpressionLexer::Tokenize
          (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           *__return_storage_ptr__,cmGeneratorExpressionLexer *this,string *input)

{
  long lVar1;
  int local_78 [8];
  char *local_58;
  char *upto;
  char *c;
  unsigned_long local_38;
  char *local_30;
  anon_enum_32 local_28;
  undefined1 local_21;
  string *local_20;
  string *input_local;
  cmGeneratorExpressionLexer *this_local;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *result;
  
  local_21 = 0;
  local_20 = input;
  input_local = (string *)this;
  this_local = (cmGeneratorExpressionLexer *)__return_storage_ptr__;
  std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::vector
            (__return_storage_ptr__);
  lVar1 = std::__cxx11::string::find((char)local_20,0x24);
  if (lVar1 == -1) {
    local_28 = Text;
    local_30 = (char *)std::__cxx11::string::c_str();
    local_38 = std::__cxx11::string::size();
    std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
    emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*,unsigned_long>
              ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
               __return_storage_ptr__,&local_28,&local_30,&local_38);
  }
  else {
    local_58 = (char *)std::__cxx11::string::c_str();
    for (upto = local_58; *upto != '\0'; upto = upto + 1) {
      switch(*upto) {
      case '$':
        if (upto[1] == '<') {
          InsertText(local_58,upto,__return_storage_ptr__);
          local_78[7] = 1;
          local_78[6] = 2;
          std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
          emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                    ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>
                      *)__return_storage_ptr__,(anon_enum_32 *)(local_78 + 7),&upto,local_78 + 6);
          local_58 = upto + 2;
          upto = upto + 1;
          this->SawBeginExpression = true;
        }
        break;
      default:
        break;
      case ',':
        InsertText(local_58,upto,__return_storage_ptr__);
        local_78[1] = 4;
        local_78[0] = 1;
        std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
        emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                  ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
                   __return_storage_ptr__,(anon_enum_32 *)(local_78 + 1),&upto,local_78);
        local_58 = upto + 1;
        break;
      case ':':
        InsertText(local_58,upto,__return_storage_ptr__);
        local_78[3] = 3;
        local_78[2] = 1;
        std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
        emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                  ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
                   __return_storage_ptr__,(anon_enum_32 *)(local_78 + 3),&upto,local_78 + 2);
        local_58 = upto + 1;
        break;
      case '>':
        InsertText(local_58,upto,__return_storage_ptr__);
        local_78[5] = 2;
        local_78[4] = 1;
        std::vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>>::
        emplace_back<cmGeneratorExpressionToken::_unnamed_type_1_,char_const*&,int>
                  ((vector<cmGeneratorExpressionToken,std::allocator<cmGeneratorExpressionToken>> *)
                   __return_storage_ptr__,(anon_enum_32 *)(local_78 + 5),&upto,local_78 + 4);
        local_58 = upto + 1;
        this->SawGeneratorExpression = (bool)(this->SawBeginExpression & 1);
      }
    }
    InsertText(local_58,upto,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGeneratorExpressionToken> cmGeneratorExpressionLexer::Tokenize(
  const std::string& input)
{
  std::vector<cmGeneratorExpressionToken> result;

  if (input.find('$') == std::string::npos) {
    result.emplace_back(cmGeneratorExpressionToken::Text, input.c_str(),
                        input.size());
    return result;
  }

  const char* c = input.c_str();
  const char* upto = c;

  for (; *c; ++c) {
    switch (*c) {
      case '$':
        if (c[1] == '<') {
          InsertText(upto, c, result);
          result.emplace_back(cmGeneratorExpressionToken::BeginExpression, c,
                              2);
          upto = c + 2;
          ++c;
          this->SawBeginExpression = true;
        }
        break;
      case '>':
        InsertText(upto, c, result);
        result.emplace_back(cmGeneratorExpressionToken::EndExpression, c, 1);
        upto = c + 1;
        this->SawGeneratorExpression = this->SawBeginExpression;
        break;
      case ':':
        InsertText(upto, c, result);
        result.emplace_back(cmGeneratorExpressionToken::ColonSeparator, c, 1);
        upto = c + 1;
        break;
      case ',':
        InsertText(upto, c, result);
        result.emplace_back(cmGeneratorExpressionToken::CommaSeparator, c, 1);
        upto = c + 1;
        break;
      default:
        break;
    }
  }
  InsertText(upto, c, result);

  return result;
}